

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mifirstclassarg.cpp
# Opt level: O1

void __thiscall GradeBook::displayMessage(GradeBook *this,string *courseName)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Welcome to the grade book for\n",0x1e);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(courseName->_M_dataplus)._M_p,
                      courseName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void displayMessage(const std::string &courseName) {
        std::cout << "Welcome to the grade book for\n"
                  << courseName << "!" << std::endl;
    }